

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::protos::gen::ThreadDescriptor::ThreadDescriptor
          (ThreadDescriptor *this,ThreadDescriptor *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  int64_t iVar5;
  int64_t iVar6;
  int32_t iVar7;
  ThreadDescriptor_ChromeThreadType TVar8;
  undefined4 uVar9;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ThreadDescriptor_003a2538;
  iVar7 = param_2->tid_;
  this->pid_ = param_2->pid_;
  this->tid_ = iVar7;
  paVar1 = &(this->thread_name_).field_2;
  (this->thread_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->thread_name_)._M_dataplus._M_p;
  paVar2 = &(param_2->thread_name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_2->thread_name_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->thread_name_).field_2 + 8) = uVar4;
  }
  else {
    (this->thread_name_)._M_dataplus._M_p = pcVar3;
    (this->thread_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->thread_name_)._M_string_length = (param_2->thread_name_)._M_string_length;
  (param_2->thread_name_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->thread_name_)._M_string_length = 0;
  (param_2->thread_name_).field_2._M_local_buf[0] = '\0';
  this->legacy_sort_index_ = param_2->legacy_sort_index_;
  TVar8 = param_2->chrome_thread_type_;
  uVar9 = *(undefined4 *)&param_2->field_0x34;
  iVar5 = param_2->reference_timestamp_us_;
  iVar6 = param_2->reference_thread_instruction_count_;
  this->reference_thread_time_us_ = param_2->reference_thread_time_us_;
  this->reference_thread_instruction_count_ = iVar6;
  this->chrome_thread_type_ = TVar8;
  *(undefined4 *)&this->field_0x34 = uVar9;
  this->reference_timestamp_us_ = iVar5;
  paVar1 = &(this->unknown_fields_).field_2;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (param_2->unknown_fields_)._M_dataplus._M_p;
  paVar2 = &(param_2->unknown_fields_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&(param_2->unknown_fields_).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->unknown_fields_).field_2 + 8) = uVar4;
  }
  else {
    (this->unknown_fields_)._M_dataplus._M_p = pcVar3;
    (this->unknown_fields_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->unknown_fields_)._M_string_length = (param_2->unknown_fields_)._M_string_length;
  (param_2->unknown_fields_)._M_dataplus._M_p = (pointer)paVar2;
  (param_2->unknown_fields_)._M_string_length = 0;
  (param_2->unknown_fields_).field_2._M_local_buf[0] = '\0';
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_2->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

ThreadDescriptor::ThreadDescriptor(ThreadDescriptor&&) noexcept = default;